

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

bool anon_unknown.dwarf_39603::StringToInt<int>(int *out,char *str)

{
  int iVar1;
  int *piVar2;
  longlong lVar3;
  bool local_41;
  longlong value;
  char *end;
  char *str_local;
  int *out_local;
  
  end = str;
  str_local = (char *)out;
  iVar1 = OPENSSL_isdigit((uint)(byte)*str);
  if ((iVar1 != 0) || (*end == '-')) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtoll(end,(char **)&value,10);
    iVar1 = std::numeric_limits<int>::min();
    if ((iVar1 <= lVar3) && (iVar1 = std::numeric_limits<int>::max(), lVar3 <= iVar1)) {
      *(int *)str_local = (int)lVar3;
      piVar2 = __errno_location();
      local_41 = false;
      if (*piVar2 != 0x22) {
        local_41 = *(char *)value == '\0';
      }
      return local_41;
    }
  }
  return false;
}

Assistant:

bool StringToInt(T *out, const char *str) {
  static_assert(std::is_integral<T>::value, "not an integral type");

  // |strtoull| allows leading '-' with wraparound. Additionally, both
  // functions accept empty strings and leading whitespace.
  if (!OPENSSL_isdigit(static_cast<unsigned char>(*str)) &&
      (!std::is_signed<T>::value || *str != '-')) {
    return false;
  }

  errno = 0;
  char *end;
  if (std::is_signed<T>::value) {
    static_assert(sizeof(T) <= sizeof(long long),
                  "type too large for long long");
    long long value = strtoll(str, &end, 10);
    if (value < static_cast<long long>(std::numeric_limits<T>::min()) ||
        value > static_cast<long long>(std::numeric_limits<T>::max())) {
      return false;
    }
    *out = static_cast<T>(value);
  } else {
    static_assert(sizeof(T) <= sizeof(unsigned long long),
                  "type too large for unsigned long long");
    unsigned long long value = strtoull(str, &end, 10);
    if (value >
        static_cast<unsigned long long>(std::numeric_limits<T>::max())) {
      return false;
    }
    *out = static_cast<T>(value);
  }

  // Check for overflow and that the whole input was consumed.
  return errno != ERANGE && *end == '\0';
}